

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

char out_parse_entity(char *outbuf,size_t outbuf_size,char **sp,size_t *slenp)

{
  ushort uVar1;
  undefined8 uVar2;
  char *pcVar3;
  byte *pbVar4;
  size_t sVar5;
  size_t sVar6;
  ushort **ppuVar7;
  char *pcVar8;
  ushort *puVar9;
  int iVar10;
  byte *pbVar11;
  ulong uVar12;
  byte bVar13;
  char cVar14;
  byte bVar15;
  uint html4_char;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  char ampbuf [10];
  amp_tbl_t *local_68;
  byte local_3a [10];
  
  uVar2 = *(undefined8 *)outbuf_size;
  pcVar3 = *sp;
  pbVar11 = local_3a;
  if (pcVar3 == (char *)0x0) {
LAB_00218d0b:
    bVar15 = 0;
  }
  else {
    *sp = pcVar3 + -1;
    pbVar4 = *(byte **)outbuf_size;
    *(byte **)outbuf_size = pbVar4 + 1;
    bVar15 = *pbVar4;
    if (bVar15 == 0x23) {
      html4_char = 0;
      if (*sp == (char *)0x0) {
        bVar15 = 0;
      }
      else {
        *sp = *sp + -1;
        pbVar11 = *(byte **)outbuf_size;
        *(byte **)outbuf_size = pbVar11 + 1;
        bVar15 = *pbVar11;
        if ((bVar15 & 0xdf) == 0x58) {
          html4_char = 0;
          if (*sp == (char *)0x0) {
            uVar12 = 0;
          }
          else {
            *sp = *sp + -1;
            pbVar11 = *(byte **)outbuf_size;
            *(byte **)outbuf_size = pbVar11 + 1;
            uVar12 = (ulong)*pbVar11;
          }
          ppuVar7 = __ctype_b_loc();
          puVar9 = *ppuVar7;
          uVar1 = puVar9[uVar12];
          bVar15 = (byte)uVar12;
          if ((uVar1 >> 0xc & 1) != 0) {
            html4_char = 0;
            do {
              cVar14 = (char)uVar12;
              if ((cVar14 < '\0') || ((uVar1 & 0x800) == 0)) {
                if ((byte)(cVar14 + 0x9fU) < 6) {
                  iVar10 = cVar14 + -0x57;
                }
                else {
                  iVar10 = cVar14 + -0x37;
                }
              }
              else {
                iVar10 = (int)uVar12 + -0x30;
              }
              if (*sp == (char *)0x0) {
                uVar12 = 0;
              }
              else {
                *sp = *sp + -1;
                pbVar11 = *(byte **)outbuf_size;
                *(byte **)outbuf_size = pbVar11 + 1;
                uVar12 = (ulong)*pbVar11;
                puVar9 = *ppuVar7;
              }
              html4_char = html4_char * 0x10 + iVar10;
              uVar1 = puVar9[uVar12];
              bVar15 = (byte)uVar12;
            } while ((uVar1 >> 0xc & 1) != 0);
          }
LAB_00218ff9:
          if (bVar15 == 0x3b) {
            if (*sp == (char *)0x0) {
              bVar15 = 0;
            }
            else {
              *sp = *sp + -1;
              pbVar11 = *(byte **)outbuf_size;
              *(byte **)outbuf_size = pbVar11 + 1;
              bVar15 = *pbVar11;
            }
          }
          goto LAB_0021902b;
        }
        if ((char)bVar15 < '\0') {
          html4_char = 0;
          goto LAB_0021902b;
        }
      }
      ppuVar7 = __ctype_b_loc();
      bVar13 = bVar15;
      do {
        bVar15 = bVar13;
        if ((*(byte *)((long)*ppuVar7 + (ulong)bVar13 * 2 + 1) & 8) == 0) goto LAB_00218ff9;
        if (*sp == (char *)0x0) {
          bVar15 = 0;
        }
        else {
          *sp = *sp + -1;
          pbVar11 = *(byte **)outbuf_size;
          *(byte **)outbuf_size = pbVar11 + 1;
          bVar15 = *pbVar11;
        }
        html4_char = ((uint)bVar13 + html4_char * 10) - 0x30;
        bVar13 = bVar15;
      } while (-1 < (char)bVar15);
      goto LAB_0021902b;
    }
    if ('\0' < (char)bVar15) {
      uVar12 = 0;
      ppuVar7 = __ctype_b_loc();
      do {
        if (((((*ppuVar7)[bVar15] >> 0xb & 1) == 0) && (((*ppuVar7)[bVar15] >> 10 & 1) == 0)) ||
           (8 < uVar12)) break;
        *pbVar11 = bVar15;
        if (*sp == (char *)0x0) {
          pbVar11 = pbVar11 + 1;
          goto LAB_00218d0b;
        }
        *sp = *sp + -1;
        pbVar4 = *(byte **)outbuf_size;
        *(byte **)outbuf_size = pbVar4 + 1;
        bVar15 = *pbVar4;
        pbVar11 = pbVar11 + 1;
        uVar12 = uVar12 + 1;
      } while ('\0' < (char)bVar15);
    }
  }
  *pbVar11 = 0;
  uVar12 = 0x131;
  local_68 = (amp_tbl_t *)0x0;
  uVar17 = 0;
  while( true ) {
    uVar16 = uVar12 - uVar17;
    uVar18 = (uVar16 >> 1) + uVar17;
    iVar10 = strcmp(amp_tbl[uVar18].cname,(char *)local_3a);
    if (iVar10 == 0) break;
    if (iVar10 < 1) {
      uVar17 = uVar17 + 1;
      if (1 < uVar16) {
        uVar17 = uVar18;
      }
    }
    else {
      if (uVar12 == 0 && uVar18 == 0) goto LAB_00218e0c;
      bVar19 = uVar18 != uVar12;
      uVar12 = uVar12 - 1;
      if (bVar19) {
        uVar12 = uVar18;
      }
    }
    if ((0x131 < uVar17) || (uVar12 < uVar17)) goto LAB_00218e0c;
  }
  local_68 = amp_tbl + uVar18;
LAB_00218e0c:
  if (bVar15 == 0x3b) {
    if (*sp == (char *)0x0) {
      bVar15 = 0;
    }
    else {
      *sp = *sp + -1;
      pbVar11 = *(byte **)outbuf_size;
      *(byte **)outbuf_size = pbVar11 + 1;
      bVar15 = *pbVar11;
    }
LAB_00218e95:
    if (local_68 == (amp_tbl_t *)0x0) {
LAB_00218edb:
      *(undefined8 *)outbuf_size = uVar2;
      *sp = pcVar3;
      if (pcVar3 == (char *)0x0) {
        cVar14 = '\0';
      }
      else {
        *sp = pcVar3 + -1;
        pcVar3 = *(char **)outbuf_size;
        *(char **)outbuf_size = pcVar3 + 1;
        cVar14 = *pcVar3;
      }
      outbuf[0] = '&';
      outbuf[1] = '\0';
      return cVar14;
    }
  }
  else {
    if (local_68 == (amp_tbl_t *)0x0) goto LAB_00218edb;
    sVar5 = strlen(local_68->cname);
    *(undefined8 *)outbuf_size = uVar2;
    *sp = pcVar3;
    iVar10 = (int)sVar5;
    pcVar8 = pcVar3;
    if (iVar10 != 0) {
      while( true ) {
        iVar10 = iVar10 + -1;
        if (pcVar8 == (char *)0x0) {
          bVar15 = 0;
        }
        else {
          *sp = pcVar8 + -1;
          pbVar11 = *(byte **)outbuf_size;
          *(byte **)outbuf_size = pbVar11 + 1;
          bVar15 = *pbVar11;
        }
        if (iVar10 == 0) break;
        pcVar8 = *sp;
      }
      goto LAB_00218e95;
    }
  }
  pcVar3 = local_68->expan;
  if (pcVar3 != (char *)0x0) {
    sVar6 = strlen(pcVar3);
    sVar5 = 0x31;
    if (sVar6 < 0x31) {
      sVar5 = sVar6;
    }
    memcpy(outbuf,pcVar3,sVar5);
    outbuf[sVar5] = '\0';
    return bVar15;
  }
  html4_char = local_68->html_cval;
LAB_0021902b:
  os_xlat_html4(html4_char,outbuf,0x32);
  return bVar15;
}

Assistant:

static char out_parse_entity(char *outbuf, size_t outbuf_size,
                             char **sp, size_t *slenp)
{
    char  ampbuf[10];
    char *dst;
    char *orig_s;
    size_t orig_slen;
    const struct amp_tbl_t *ampptr;
    size_t lo, hi, cur;
    char  c;

    /* 
     *   remember where the part after the '&' begins, so we can come back
     *   here later if necessary 
     */
    orig_s = *sp;
    orig_slen = *slenp;

    /* get the character after the ampersand */
    c = nextout(sp, slenp);

    /* if it's numeric, parse the number */
    if (c == '#')
    {
        uint val;
        
        /* skip the '#' */
        c = nextout(sp, slenp);

        /* check for hex */
        if (c == 'x' || c == 'X')
        {
            /* skip the 'x' */
            c = nextout(sp, slenp);

            /* read the hex number */
            for (val = 0 ; isxdigit((uchar)c) ; c = nextout(sp, slenp))
            {
                /* accumulate the current digit into the value */
                val *= 16;
                if (outisdg(c))
                    val += c - '0';
                else if (c >= 'a' && c <= 'f')
                    val += c - 'a' + 10;
                else
                    val += c - 'A' + 10;
            }
        }
        else
        {
            /* read the number */
            for (val = 0 ; outisdg(c) ; c = nextout(sp, slenp))
            {
                /* accumulate the current digit into the value */
                val *= 10;
                val += c - '0';
            }
        }
        
        /* if we found a ';' at the end, skip it */
        if (c == ';')
            c = nextout(sp, slenp);
        
        /* translate the character into the output buffer */
        os_xlat_html4(val, outbuf, outbuf_size);
        
        /* we're done with this character */
        return c;
    }

    /*
     *   Parse the sequence after the '&'.  Parse up to the closing
     *   semicolon, or any non-alphanumeric, or until we fill up the buffer.
     */
    for (dst = ampbuf ;
         c != '\0' && (outisdg(c) || outisal(c))
             && dst < ampbuf + sizeof(ampbuf) - 1 ;
         *dst++ = c, c = nextout(sp, slenp)) ;
    
    /* null-terminate the name */
    *dst = '\0';
    
    /* do a binary search for the name */
    lo = 0;
    hi = sizeof(amp_tbl)/sizeof(amp_tbl[0]) - 1;
    for (;;)
    {
        int diff;
        
        /* if we've converged, look no further */
        if (lo > hi || lo >= sizeof(amp_tbl)/sizeof(amp_tbl[0]))
        {
            ampptr = 0;
            break;
        }
        
        /* split the difference */
        cur = lo + (hi - lo)/2;
        ampptr = &amp_tbl[cur];
        
        /* see where we are relative to the target item */
        diff = strcmp(ampptr->cname, ampbuf);
        if (diff == 0)
        {
            /* this is it */
            break;
        }
        else if (diff > 0)
        {
            /* make sure we don't go off the end */
            if (cur == hi && cur == 0)
            {
                /* we've failed to find it */
                ampptr = 0;
                break;
            }
            
            /* this one is too high - check the lower half */
            hi = (cur == hi ? hi - 1 : cur);
        }
        else
        {
            /* this one is too low - check the upper half */
            lo = (cur == lo ? lo + 1 : cur);
        }
    }
    
    /* skip to the appropriate next character */
    if (c == ';')
    {
        /* name ended with semicolon - skip the semicolon */
        c = nextout(sp, slenp);
    }
    else if (ampptr != 0)
    {
        int skipcnt;
        
        /* found the name - skip its exact length */
        skipcnt = strlen(ampptr->cname);
        for (*sp = orig_s, *slenp = orig_slen ; skipcnt != 0 ;
             c = nextout(sp, slenp), --skipcnt) ;
    }
    
    /* if we found the entry, write out the character */
    if (ampptr != 0)
    {
        /* 
         *   if this one has an external mapping table entry, use the mapping
         *   table entry; otherwise, use the default OS routine mapping 
         */
        if (ampptr->expan != 0)
        {
            /* 
             *   we have an explicit expansion from the mapping table file -
             *   use it 
             */
            size_t copylen = strlen(ampptr->expan);
            if (copylen > outbuf_size - 1)
                copylen = outbuf_size - 1;

            memcpy(outbuf, ampptr->expan, copylen);
            outbuf[copylen] = '\0';
        }
        else
        {
            /* 
             *   there's no mapping table expansion - use the default OS code
             *   expansion 
             */
            os_xlat_html4(ampptr->html_cval, outbuf, outbuf_size);
        }
    }
    else
    {
        /* 
         *   didn't find it - output the '&' literally, then back up and
         *   output the entire sequence following 
         */
        *sp = orig_s;
        *slenp = orig_slen;
        c = nextout(sp, slenp);

        /* fill in the '&' return value */
        outbuf[0] = '&';
        outbuf[1] = '\0';
    }

    /* return the next character */
    return c;
}